

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O3

void __thiscall cubeb_async_logger::push(cubeb_async_logger *this,char *str)

{
  ring_buffer_base<cubeb_log_message> *this_00;
  size_t __n;
  bool bVar1;
  cubeb_log_message msg;
  cubeb_log_message cStack_118;
  
  memset(&cStack_118,0,0x100);
  __n = strlen(str);
  if (__n < 0x100) {
    memcpy(&cStack_118,str,__n);
    cStack_118.storage[__n] = '\0';
  }
  this_00 = (this->msg_queue)._M_b._M_p;
  if (this_00 != (ring_buffer_base<cubeb_log_message> *)0x0) {
    LOCK();
    bVar1 = this_00 == (this->msg_queue)._M_b._M_p;
    if (bVar1) {
      (this->msg_queue)._M_b._M_p = (__pointer_type)0x0;
    }
    UNLOCK();
    if (bVar1) {
      ring_buffer_base<cubeb_log_message>::enqueue(this_00,&cStack_118,1);
      LOCK();
      (this->msg_queue)._M_b._M_p = this_00;
      UNLOCK();
    }
  }
  return;
}

Assistant:

void push(char const str[CUBEB_LOG_MESSAGE_MAX_SIZE])
  {
    cubeb_log_message msg(str);
    auto * owned_queue = msg_queue.load();
    // Check if the queue is being deallocated. If not, grab ownership. If yes,
    // return, the message won't be logged.
    if (!owned_queue ||
        !msg_queue.compare_exchange_strong(owned_queue, nullptr)) {
      return;
    }
    owned_queue->enqueue(msg);
    // Return ownership.
    msg_queue.store(owned_queue);
  }